

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVH.cpp
# Opt level: O3

void SimpleBVH::point_triangle_squared_distance
               (VectorMax3d *x,array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_3UL> *f,VectorMax3d *pt,
               double *dist)

{
  Index *pIVar1;
  double *pdVar2;
  Matrix<double,__1,_1,_0,_3,_1> *pMVar3;
  plainobjectbase_evaluator_data<double,_0> pVar4;
  double *pdVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  Index size;
  ulong uVar9;
  double dVar10;
  char *pcVar11;
  double dVar12;
  ulong uVar13;
  SrcEvaluatorType srcEvaluator_2;
  char cVar14;
  long lVar15;
  ulong uVar16;
  scalar_sum_op<double,_double> *func;
  long lVar17;
  double dVar18;
  long lVar19;
  SrcEvaluatorType srcEvaluator;
  SrcEvaluatorType srcEvaluator_1;
  ActualDstType actualDst;
  double dVar20;
  Scalar SVar21;
  Scalar SVar22;
  Scalar SVar23;
  RealScalar RVar24;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 uVar25;
  double dVar26;
  double local_190 [4];
  Scalar local_170;
  double local_168;
  undefined8 uStack_160;
  Scalar local_158;
  undefined8 uStack_150;
  undefined1 local_148 [40];
  long local_120;
  double local_110;
  undefined1 local_f8 [8];
  VectorMax3d bx;
  VectorMax3d cx;
  undefined1 local_a0 [8];
  VectorMax3d ab;
  double local_60 [4];
  double *local_40;
  scalar_sum_op<double,_double> local_31;
  
  dVar20 = (double)f->_M_elems[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                   m_storage.m_rows;
  if (dVar20 != (double)f->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
                        .m_storage.m_rows) goto LAB_00116ede;
  ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data.array[2] = 0.0;
  if (3 < (ulong)dVar20) goto LAB_00116f1c;
  ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       dVar20;
  dVar12 = 0.0;
  cVar14 = SUB81(dVar20,0);
  dVar18 = (double)(ulong)((uint)(byte)((char)(((byte)(((ulong)dVar20 & 0xffffffff) >> 7) & 1) +
                                              cVar14) >> 1) * 2);
  pMVar3 = f->_M_elems + 1;
  if (1 < (long)dVar20) {
    do {
      pdVar2 = f->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
               m_storage.m_data.array + (long)dVar12;
      dVar10 = pdVar2[1];
      pdVar5 = (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
               m_data.array + (long)dVar12;
      dVar26 = pdVar5[1];
      ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data.array
      [(long)dVar12 - 1] = *pdVar5 - *pdVar2;
      ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data.array
      [(long)dVar12] = dVar26 - dVar10;
      dVar12 = (double)((long)dVar12 + 2);
    } while ((ulong)dVar12 < (ulong)dVar18);
  }
  if ((long)dVar18 < (long)dVar20) {
    do {
      ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data.array
      [(long)dVar18 - 1] =
           (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_data.
           array[(long)dVar18] -
           f->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
           m_data.array[(long)dVar18];
      dVar18 = (double)((long)dVar18 + 1);
    } while (dVar20 != dVar18);
  }
  if ((double)f->_M_elems[2].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage
              .m_rows == dVar20) {
    local_40 = dist;
    local_60[3] = dVar20;
    dVar18 = 0.0;
    dVar12 = (double)(ulong)((uint)(byte)((char)(((byte)(((ulong)dVar20 & 0xffffffff) >> 7) & 1) +
                                                cVar14) >> 1) * 2);
    pVar4.data = (double *)(f->_M_elems + 2);
    if (1 < (long)dVar20) {
      do {
        pdVar2 = f->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                 m_storage.m_data.array + (long)dVar18;
        dVar10 = pdVar2[1];
        dVar26 = (pVar4.data + (long)dVar18)[1];
        local_60[(long)dVar18] = pVar4.data[(long)dVar18] - *pdVar2;
        local_60[(long)dVar18 + 1] = dVar26 - dVar10;
        dVar18 = (double)((long)dVar18 + 2);
      } while ((ulong)dVar18 < (ulong)dVar12);
    }
    if ((long)dVar12 < (long)dVar20) {
      do {
        local_60[(long)dVar12] =
             pVar4.data[(long)dVar12] -
             f->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
             m_data.array[(long)dVar12];
        dVar12 = (double)((long)dVar12 + 1);
      } while (dVar20 != dVar12);
    }
    if ((double)(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_rows
        == dVar20) {
      dVar18 = 0.0;
      dVar12 = (double)(ulong)((uint)(byte)((char)(((byte)(((ulong)dVar20 & 0xffffffff) >> 7) & 1) +
                                                  cVar14) >> 1) * 2);
      local_190[3] = dVar20;
      if (1 < (long)dVar20) {
        do {
          pdVar2 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
                   m_data.array + (long)dVar18;
          dVar10 = pdVar2[1];
          pdVar5 = f->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                   m_storage.m_data.array + (long)dVar18;
          dVar26 = pdVar5[1];
          local_190[(long)dVar18] = *pdVar2 - *pdVar5;
          local_190[(long)dVar18 + 1] = dVar10 - dVar26;
          dVar18 = (double)((long)dVar18 + 2);
        } while ((ulong)dVar18 < (ulong)dVar12);
      }
      if ((long)dVar12 < (long)dVar20) {
        do {
          local_190[(long)dVar12] =
               (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_data.
               array[(long)dVar12] -
               f->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
               m_storage.m_data.array[(long)dVar12];
          dVar12 = (double)((long)dVar12 + 1);
        } while (dVar20 != dVar12);
      }
      if (ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
          != local_190[3]) goto LAB_00116efd;
      ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_rows =
           (Index)local_a0;
      if (ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
          != 0.0) {
        if (0 < (long)ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                      m_data.array[2]) {
          local_148._8_8_ = local_a0;
          local_148._16_8_ = local_190;
          dVar20 = Eigen::internal::
                   redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,3,1>const,Eigen::Matrix<double,-1,1,0,3,1>const>>,3,0>
                   ::
                   run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::Matrix<double,_1,1,0,3,1>const>>
                             ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                               *)local_148,(scalar_sum_op<double,_double> *)local_f8,
                              (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
                               *)&ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                                  m_storage.m_rows);
          if (local_60[3] != local_190[3]) goto LAB_00116efd;
          ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_rows =
               (Index)local_60;
          if (local_190[3] == 0.0) goto LAB_00116428;
          cx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_rows =
               (Index)dVar20;
          if ((long)local_190[3] < 1) goto LAB_00116f3b;
          local_148._8_8_ = local_60;
          local_148._16_8_ = local_190;
          SVar21 = Eigen::internal::
                   redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,3,1>const,Eigen::Matrix<double,-1,1,0,3,1>const>>,3,0>
                   ::
                   run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::Matrix<double,_1,1,0,3,1>const>>
                             ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                               *)local_148,(scalar_sum_op<double,_double> *)local_f8,
                              (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
                               *)&ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                                  m_storage.m_rows);
          dVar20 = (double)cx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                           m_storage.m_rows;
          uVar25 = extraout_XMM0_Qb;
          goto LAB_0011642c;
        }
        goto LAB_00116f3b;
      }
      if (local_60[3] != 0.0) goto LAB_00116efd;
      dVar20 = 0.0;
LAB_00116428:
      SVar21 = 0.0;
      uVar25 = 0;
LAB_0011642c:
      if ((dVar20 <= 0.0) && (SVar21 <= 0.0)) {
        uVar16 = f->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                 m_storage.m_rows;
        if ((pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_rows !=
            uVar16) {
          if (3 < uVar16) goto LAB_00116f1c;
          (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_rows =
               uVar16;
        }
        uVar13 = (ulong)((uint)((ulong)pt >> 3) & 1);
        if ((long)uVar16 <= (long)uVar13) {
          uVar13 = uVar16;
        }
        lVar15 = uVar16 - uVar13;
        if (0 < (long)uVar13) {
          (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_data.array
          [0] = f->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                m_storage.m_data.array[0];
        }
        uVar9 = (lVar15 - (lVar15 >> 0x3f) & 0xfffffffffffffffeU) + uVar13;
        if (1 < lVar15) {
          do {
            pdVar2 = f->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                     m_storage.m_data.array + uVar13;
            dVar20 = pdVar2[1];
            pdVar5 = (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
                     m_data.array + uVar13;
            *pdVar5 = *pdVar2;
            pdVar5[1] = dVar20;
            uVar13 = uVar13 + 2;
          } while ((long)uVar13 < (long)uVar9);
        }
        if ((long)uVar9 < (long)uVar16) {
          do {
            (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_data.
            array[uVar9] = f->_M_elems[0].
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                           m_data.array[uVar9];
            uVar9 = uVar9 + 1;
          } while (uVar16 != uVar9);
        }
        lVar15 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_rows
        ;
        if (lVar15 != (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
                      m_rows) goto LAB_00116ede;
        if (lVar15 != 0) {
          if (lVar15 < 1) {
LAB_00116f52:
            pcVar11 = 
            "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
            ;
            local_148._8_8_ = x;
            local_148._16_8_ = pt;
LAB_00116f67:
            __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                          "/root/.cache/CPM/eigen/9cb760a6fcc3143cbb7856ce4548b1cf4b385f2e/Eigen/src/Core/Redux.h"
                          ,0x19b,pcVar11);
          }
          func = (scalar_sum_op<double,_double> *)local_f8;
LAB_00116a30:
          pdVar2 = local_40;
          local_148._8_8_ = x;
          local_148._16_8_ = pt;
          dVar20 = Eigen::internal::
                   redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,3,1>const,Eigen::Matrix<double,-1,1,0,3,1>const>const>>,3,0>
                   ::
                   run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::Matrix<double,_1,1,0,3,1>const>const>>
                             ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
                               *)&ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                                  m_storage.m_rows,func,
                              (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                               *)local_148);
          local_40 = pdVar2;
          goto LAB_00116e51;
        }
LAB_00116e4d:
        dVar20 = 0.0;
LAB_00116e51:
        *local_40 = dVar20;
        return;
      }
      dVar12 = (double)(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
                       m_rows;
      if (dVar12 != (double)f->_M_elems[1].
                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                            m_rows) goto LAB_00116ede;
      bx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
           0.0;
      if (3 < (ulong)dVar12) goto LAB_00116f1c;
      dVar18 = (double)(ulong)((uint)((ulong)local_f8 >> 3) & 1);
      if ((ulong)dVar12 <= (ulong)dVar18) {
        dVar18 = dVar12;
      }
      uVar16 = (long)dVar12 - (long)dVar18;
      if (dVar18 != 0.0) {
        local_f8 = (undefined1  [8])
                   ((x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
                    m_data.array[0] -
                   (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage
                   .m_data.array[0]);
      }
      dVar10 = (double)((ulong)((uint)(byte)((char)(((byte)((uVar16 & 0xffffffff) >> 7) & 1) +
                                                   (char)uVar16) >> 1) * 2) | (ulong)dVar18);
      bx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
           dVar12;
      cx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_rows =
           (Index)dVar20;
      if (1 < (long)uVar16) {
        do {
          pdVar2 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
                   m_data.array + (long)dVar18;
          dVar20 = pdVar2[1];
          pdVar5 = (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage
                   .m_data.array + (long)dVar18;
          dVar26 = pdVar5[1];
          bx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data.array
          [(long)dVar18 - 1] = *pdVar2 - *pdVar5;
          bx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data.array
          [(long)dVar18] = dVar20 - dVar26;
          dVar18 = (double)((long)dVar18 + 2);
        } while ((ulong)dVar18 < (ulong)dVar10);
      }
      if ((long)dVar10 < (long)dVar12) {
        do {
          bx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data.array
          [(long)dVar10 - 1] =
               (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_data.
               array[(long)dVar10] -
               (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
               m_data.array[(long)dVar10];
          dVar10 = (double)((long)dVar10 + 1);
        } while (dVar12 != dVar10);
      }
      if (ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
          != bx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data.array
             [2]) goto LAB_00116efd;
      local_168 = SVar21;
      uStack_160 = uVar25;
      ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_rows =
           (Index)local_a0;
      if (ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
          != 0.0) {
        if (0 < (long)ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                      m_data.array[2]) {
          local_148._8_8_ = (VectorMax3d *)local_a0;
          local_148._16_8_ = (Matrix<double,__1,_1,_0,_3,_1> *)local_f8;
          SVar21 = Eigen::internal::
                   redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,3,1>const,Eigen::Matrix<double,-1,1,0,3,1>const>>,3,0>
                   ::
                   run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::Matrix<double,_1,1,0,3,1>const>>
                             ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                               *)local_148,
                              (scalar_sum_op<double,_double> *)
                              &bx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                               m_storage.m_rows,
                              (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
                               *)&ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                                  m_storage.m_rows);
          if (local_60[3] !=
              bx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data.
              array[2]) goto LAB_00116efd;
          ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_rows =
               (Index)local_60;
          uVar25 = extraout_XMM0_Qb_00;
          if (bx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data.
              array[2] == 0.0) goto LAB_001166ba;
          local_158 = SVar21;
          uStack_150 = extraout_XMM0_Qb_00;
          if ((long)bx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                    m_data.array[2] < 1) goto LAB_00116f3b;
          local_148._8_8_ = local_60;
          uStack_150 = extraout_XMM0_Qb_00;
          local_148._16_8_ = local_f8;
          SVar22 = Eigen::internal::
                   redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,3,1>const,Eigen::Matrix<double,-1,1,0,3,1>const>>,3,0>
                   ::
                   run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::Matrix<double,_1,1,0,3,1>const>>
                             ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                               *)local_148,
                              (scalar_sum_op<double,_double> *)
                              &bx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                               m_storage.m_rows,
                              (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
                               *)&ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                                  m_storage.m_rows);
          SVar21 = local_158;
          uVar25 = uStack_150;
          goto LAB_001166be;
        }
        goto LAB_00116f3b;
      }
      if (local_60[3] != 0.0) goto LAB_00116efd;
      SVar21 = 0.0;
      uVar25 = 0;
LAB_001166ba:
      SVar22 = 0.0;
LAB_001166be:
      if ((SVar21 < 0.0) || (SVar21 < SVar22)) {
        dVar20 = (double)(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
                         m_storage.m_rows;
        if (dVar20 == (double)f->_M_elems[2].
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                              m_storage.m_rows) {
          cx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
               = 0.0;
          if (3 < (ulong)dVar20) goto LAB_00116f1c;
          pIVar1 = &bx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                    m_rows;
          dVar12 = (double)(ulong)((uint)((ulong)pIVar1 >> 3) & 1);
          if ((ulong)dVar20 <= (ulong)dVar12) {
            dVar12 = dVar20;
          }
          uVar16 = (long)dVar20 - (long)dVar12;
          if (dVar12 != 0.0) {
            bx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_rows =
                 (Index)((x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
                         m_storage.m_data.array[0] - *pVar4.data);
          }
          dVar18 = (double)((ulong)((uint)(byte)((char)(((byte)((uVar16 & 0xffffffff) >> 7) & 1) +
                                                       (char)uVar16) >> 1) * 2) | (ulong)dVar12);
          cx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
               = dVar20;
          if (1 < (long)uVar16) {
            do {
              pdVar2 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
                       m_data.array + (long)dVar12;
              dVar10 = pdVar2[1];
              dVar26 = (pVar4.data + (long)dVar12)[1];
              *(double *)
               ((long)(&bx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                        m_data + 1) + dVar12 * 8) = *pdVar2 - pVar4.data[(long)dVar12];
              cx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data.
              array[(long)dVar12] = dVar10 - dVar26;
              dVar12 = (double)((long)dVar12 + 2);
            } while ((ulong)dVar12 < (ulong)dVar18);
          }
          if ((long)dVar18 < (long)dVar20) {
            do {
              *(double *)
               ((long)(&bx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                        m_data + 1) + dVar18 * 8) =
                   (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
                   m_data.array[(long)dVar18] - pVar4.data[(long)dVar18];
              dVar18 = (double)((long)dVar18 + 1);
            } while (dVar20 != dVar18);
          }
          if (ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data.
              array[2] !=
              cx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data.
              array[2]) {
LAB_00116efd:
            __assert_fail("size() == other.size()",
                          "/root/.cache/CPM/eigen/9cb760a6fcc3143cbb7856ce4548b1cf4b385f2e/Eigen/src/Core/Dot.h"
                          ,0x52,
                          "typename ScalarBinaryOpTraits<typename internal::traits<Derived>::Scalar, typename internal::traits<OtherDerived>::Scalar>::ReturnType Eigen::MatrixBase<Eigen::Matrix<double, -1, 1, 0, 3, 1>>::dot(const MatrixBase<OtherDerived> &) const [Derived = Eigen::Matrix<double, -1, 1, 0, 3, 1>, OtherDerived = Eigen::Matrix<double, -1, 1, 0, 3, 1>]"
                         );
          }
          ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_rows =
               (Index)local_a0;
          if (ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data.
              array[2] == 0.0) {
            if (local_60[3] != 0.0) goto LAB_00116efd;
            SVar23 = 0.0;
LAB_00116954:
            dVar20 = 0.0;
          }
          else {
            local_158 = SVar21;
            uStack_150 = uVar25;
            if ((long)ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                      m_data.array[2] < 1) {
LAB_00116f3b:
              pcVar11 = 
              "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
              ;
              goto LAB_00116f67;
            }
            local_148._8_8_ = local_a0;
            local_148._16_8_ = pIVar1;
            SVar23 = Eigen::internal::
                     redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,3,1>const,Eigen::Matrix<double,-1,1,0,3,1>const>>,3,0>
                     ::
                     run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::Matrix<double,_1,1,0,3,1>const>>
                               ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                                 *)local_148,&local_31,
                                (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
                                 *)&ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
                                    .m_storage.m_rows);
            if (local_60[3] !=
                cx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data.
                array[2]) goto LAB_00116efd;
            ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_rows =
                 (Index)local_60;
            SVar21 = local_158;
            if (cx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data.
                array[2] == 0.0) goto LAB_00116954;
            local_170 = SVar23;
            if ((long)cx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                      m_data.array[2] < 1) goto LAB_00116f3b;
            local_148._8_8_ = local_60;
            local_148._16_8_ =
                 &bx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_rows;
            dVar20 = Eigen::internal::
                     redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,3,1>const,Eigen::Matrix<double,-1,1,0,3,1>const>>,3,0>
                     ::
                     run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::Matrix<double,_1,1,0,3,1>const>>
                               ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                                 *)local_148,&local_31,
                                (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
                                 *)&ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
                                    .m_storage.m_rows);
            SVar21 = local_158;
            SVar23 = local_170;
          }
          if ((dVar20 < 0.0) || (dVar20 < SVar23)) {
            dVar12 = (double)cx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                             m_storage.m_rows * SVar22 - local_168 * SVar21;
            if ((-SVar21 < SVar21) ||
               (((double)cx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                         m_rows < 0.0 || (0.0 < dVar12)))) {
              dVar18 = SVar23 * local_168 -
                       (double)cx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                               m_storage.m_rows * dVar20;
              if ((0.0 < dVar20) || ((local_168 < 0.0 || (0.0 < dVar18)))) {
                dVar10 = SVar21 * dVar20 - SVar22 * SVar23;
                if ((dVar10 <= 0.0) &&
                   ((dVar26 = SVar22 - SVar21, 0.0 <= dVar26 && (0.0 <= SVar23 - dVar20)))) {
                  lVar15 = f->_M_elems[2].
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                           m_rows;
                  if (lVar15 == f->_M_elems[1].
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                                m_storage.m_rows) {
                    if (lVar15 < 0) goto LAB_00116f71;
                    local_110 = dVar26 / ((SVar23 - dVar20) + dVar26);
                    local_148._0_8_ = pMVar3;
                    local_148._16_8_ = pVar4.data;
                    local_148._24_8_ = pMVar3;
                    local_120 = lVar15;
                    Eigen::Matrix<double,-1,1,0,3,1>::operator=
                              ((Matrix<double,_1,1,0,3,1> *)pt,
                               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>_>
                                *)local_148);
                    local_148._0_8_ = x;
                    local_148._8_8_ = pt;
                    if ((x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage
                        .m_rows ==
                        (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
                        m_storage.m_rows) {
                      RVar24 = Eigen::
                               MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_3,_1>_>_>
                               ::squaredNorm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                                              *)local_148);
                      *local_40 = RVar24;
                      return;
                    }
                  }
                  goto LAB_00116ede;
                }
                if ((long)ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage
                          .m_data.array[2] < 0) {
LAB_00116f71:
                  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                                ,
                                "/root/.cache/CPM/eigen/9cb760a6fcc3143cbb7856ce4548b1cf4b385f2e/Eigen/src/Core/CwiseNullaryOp.h"
                                ,0x4a,
                                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1, 0, 3, 1>]"
                               );
                }
                if ((double)f->_M_elems[0].
                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                            m_rows !=
                    ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                    m_data.array[2]) goto LAB_00116f90;
                if ((long)local_60[3] < 0) goto LAB_00116f71;
                if (ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                    m_data.array[2] != local_60[3]) {
                  pcVar11 = 
                  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>>]"
                  ;
                  goto LAB_00116ef3;
                }
                if ((double)(pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
                            m_storage.m_rows !=
                    ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                    m_data.array[2]) {
                  if (3 < (ulong)ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[2]) goto LAB_00116f1c;
                  (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
                  m_rows = (Index)ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                                  m_storage.m_data.array[2];
                }
                dVar10 = 1.0 / (dVar10 + dVar18 + dVar12);
                dVar18 = dVar18 * dVar10;
                dVar10 = dVar10 * dVar12;
                dVar20 = (double)(ulong)((uint)((ulong)pt >> 3) & 1);
                if ((ulong)ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                           m_storage.m_data.array[2] <= (ulong)dVar20) {
                  dVar20 = ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                           m_storage.m_data.array[2];
                }
                lVar15 = (long)ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                               m_storage.m_data.array[2] - (long)dVar20;
                if (dVar20 != 0.0) {
                  (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
                  m_data.array[0] =
                       local_60[0] * dVar10 +
                       (double)local_a0 * dVar18 +
                       f->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                       m_storage.m_data.array[0];
                }
                dVar26 = (double)(lVar15 - (lVar15 >> 0x3f) & 0xfffffffffffffffeU | (ulong)dVar20);
                dVar12 = dVar20;
                if (1 < lVar15) {
                  do {
                    pdVar2 = f->_M_elems[0].
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage
                             .m_data.array + (long)dVar12;
                    dVar6 = pdVar2[1];
                    dVar7 = ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                            m_storage.m_data.array[(long)dVar12];
                    dVar8 = local_60[(long)dVar12 + 1];
                    pdVar5 = (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
                             m_storage.m_data.array + (long)dVar12;
                    *pdVar5 = local_60[(long)dVar12] * dVar10 +
                              ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                              m_storage.m_data.array[(long)dVar12 - 1] * dVar18 + *pdVar2;
                    pdVar5[1] = dVar8 * dVar10 + dVar7 * dVar18 + dVar6;
                    dVar12 = (double)((long)dVar12 + 2);
                  } while ((ulong)dVar12 < (ulong)dVar26);
                }
                if ((long)dVar26 <
                    (long)ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage
                          .m_data.array[2]) {
                  lVar17 = lVar15 / 2;
                  lVar19 = 0;
                  do {
                    (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
                    m_data.array[(long)dVar20 + lVar17 * 2 + lVar19] =
                         local_60[(long)dVar20 + lVar17 * 2 + lVar19] * dVar10 +
                         ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                         m_data.array[(long)dVar20 + lVar17 * 2 + lVar19 + -1] * dVar18 +
                         f->_M_elems[0].
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                         m_data.array[(long)dVar20 + lVar17 * 2 + lVar19];
                    lVar19 = lVar19 + 1;
                  } while (lVar15 % 2 != lVar19);
                }
              }
              else {
                if ((long)local_60[3] < 0) goto LAB_00116f71;
                if ((double)f->_M_elems[0].
                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                            m_rows != local_60[3]) goto LAB_00116f90;
                if ((double)(pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
                            m_storage.m_rows != local_60[3]) {
                  if (3 < (ulong)local_60[3]) goto LAB_00116f1c;
                  (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
                  m_rows = (Index)local_60[3];
                }
                dVar12 = (double)(ulong)((uint)((ulong)pt >> 3) & 1);
                if ((ulong)local_60[3] <= (ulong)dVar12) {
                  dVar12 = local_60[3];
                }
                dVar20 = local_168 / (local_168 - dVar20);
                lVar15 = (long)local_60[3] - (long)dVar12;
                if (dVar12 != 0.0) {
                  (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
                  m_data.array[0] =
                       local_60[0] * dVar20 +
                       f->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                       m_storage.m_data.array[0];
                }
                dVar18 = (double)(lVar15 - (lVar15 >> 0x3f) & 0xfffffffffffffffeU | (ulong)dVar12);
                if (1 < lVar15) {
                  do {
                    pdVar2 = f->_M_elems[0].
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage
                             .m_data.array + (long)dVar12;
                    dVar10 = pdVar2[1];
                    dVar26 = local_60[(long)dVar12 + 1];
                    pdVar5 = (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
                             m_storage.m_data.array + (long)dVar12;
                    *pdVar5 = local_60[(long)dVar12] * dVar20 + *pdVar2;
                    pdVar5[1] = dVar26 * dVar20 + dVar10;
                    dVar12 = (double)((long)dVar12 + 2);
                  } while ((ulong)dVar12 < (ulong)dVar18);
                }
                if ((long)dVar18 < (long)local_60[3]) {
                  do {
                    (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
                    m_data.array[(long)dVar18] =
                         local_60[(long)dVar18] * dVar20 +
                         f->_M_elems[0].
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                         m_data.array[(long)dVar18];
                    dVar18 = (double)((long)dVar18 + 1);
                  } while (local_60[3] != dVar18);
                }
              }
            }
            else {
              if ((long)ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                        m_data.array[2] < 0) goto LAB_00116f71;
              if ((double)f->_M_elems[0].
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                          m_rows !=
                  ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data.
                  array[2]) {
LAB_00116f90:
                pcVar11 = 
                "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1, 0, 3, 1>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>>]"
                ;
                goto LAB_00116ef3;
              }
              if ((double)(pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
                          m_storage.m_rows !=
                  ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data.
                  array[2]) {
                if (3 < (ulong)ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                               m_storage.m_data.array[2]) goto LAB_00116f1c;
                (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_rows
                     = (Index)ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                              m_storage.m_data.array[2];
              }
              dVar20 = (double)(ulong)((uint)((ulong)pt >> 3) & 1);
              if ((ulong)ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                         m_data.array[2] <= (ulong)dVar20) {
                dVar20 = ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                         m_data.array[2];
              }
              dVar12 = (double)cx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                               m_storage.m_rows /
                       ((double)cx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                                m_storage.m_rows - SVar21);
              lVar15 = (long)ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                             m_storage.m_data.array[2] - (long)dVar20;
              if (dVar20 != 0.0) {
                (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_data
                .array[0] = (double)local_a0 * dVar12 +
                            f->_M_elems[0].
                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                            m_data.array[0];
              }
              dVar18 = (double)(lVar15 - (lVar15 >> 0x3f) & 0xfffffffffffffffeU | (ulong)dVar20);
              if (1 < lVar15) {
                do {
                  pdVar2 = f->_M_elems[0].
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                           m_data.array + (long)dVar20;
                  dVar10 = pdVar2[1];
                  dVar26 = ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                           m_storage.m_data.array[(long)dVar20];
                  pdVar5 = (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
                           m_storage.m_data.array + (long)dVar20;
                  *pdVar5 = ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                            m_storage.m_data.array[(long)dVar20 - 1] * dVar12 + *pdVar2;
                  pdVar5[1] = dVar26 * dVar12 + dVar10;
                  dVar20 = (double)((long)dVar20 + 2);
                } while ((ulong)dVar20 < (ulong)dVar18);
              }
              if ((long)dVar18 <
                  (long)ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                        m_data.array[2]) {
                do {
                  (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
                  m_data.array[(long)dVar18] =
                       ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                       m_data.array[(long)dVar18 - 1] * dVar12 +
                       f->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                       m_storage.m_data.array[(long)dVar18];
                  dVar18 = (double)((long)dVar18 + 1);
                } while (ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                         m_data.array[2] != dVar18);
              }
            }
            lVar15 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
                     m_rows;
            if (lVar15 == (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
                          m_storage.m_rows) goto joined_r0x00116e47;
          }
          else {
            uVar16 = f->_M_elems[2].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                     m_storage.m_rows;
            if ((pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_rows
                != uVar16) {
              if (3 < uVar16) {
LAB_00116f1c:
                __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                              ,
                              "/root/.cache/CPM/eigen/9cb760a6fcc3143cbb7856ce4548b1cf4b385f2e/Eigen/src/Core/PlainObjectBase.h"
                              ,0x115,
                              "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1, 0, 3, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1, 0, 3, 1>]"
                             );
              }
              (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_rows =
                   uVar16;
            }
            uVar13 = (ulong)((uint)((ulong)pt >> 3) & 1);
            if ((long)uVar16 <= (long)uVar13) {
              uVar13 = uVar16;
            }
            lVar15 = uVar16 - uVar13;
            if (0 < (long)uVar13) {
              (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_data.
              array[0] = *pVar4.data;
            }
            uVar9 = (lVar15 - (lVar15 >> 0x3f) & 0xfffffffffffffffeU) + uVar13;
            if (1 < lVar15) {
              do {
                dVar20 = (pVar4.data + uVar13)[1];
                pdVar2 = (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
                         m_storage.m_data.array + uVar13;
                *pdVar2 = pVar4.data[uVar13];
                pdVar2[1] = dVar20;
                uVar13 = uVar13 + 2;
              } while ((long)uVar13 < (long)uVar9);
            }
            if ((long)uVar9 < (long)uVar16) {
              do {
                (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_data
                .array[uVar9] = pVar4.data[uVar9];
                uVar9 = uVar9 + 1;
              } while (uVar16 != uVar9);
            }
            lVar15 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
                     m_rows;
            if (lVar15 == (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
                          m_storage.m_rows) {
joined_r0x00116e47:
              if (lVar15 != 0) {
                if (lVar15 < 1) goto LAB_00116f52;
                func = &local_31;
                goto LAB_00116a30;
              }
              goto LAB_00116e4d;
            }
          }
        }
      }
      else {
        uVar16 = f->_M_elems[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                 m_storage.m_rows;
        if ((pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_rows !=
            uVar16) {
          if (3 < uVar16) goto LAB_00116f1c;
          (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_rows =
               uVar16;
        }
        uVar13 = (ulong)((uint)((ulong)pt >> 3) & 1);
        if ((long)uVar16 <= (long)uVar13) {
          uVar13 = uVar16;
        }
        lVar15 = uVar16 - uVar13;
        if (0 < (long)uVar13) {
          (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_data.array
          [0] = (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
                m_data.array[0];
        }
        uVar9 = (lVar15 - (lVar15 >> 0x3f) & 0xfffffffffffffffeU) + uVar13;
        if (1 < lVar15) {
          do {
            pdVar5 = (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
                     m_storage.m_data.array + uVar13;
            dVar20 = pdVar5[1];
            pdVar2 = (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
                     m_data.array + uVar13;
            *pdVar2 = *pdVar5;
            pdVar2[1] = dVar20;
            uVar13 = uVar13 + 2;
          } while ((long)uVar13 < (long)uVar9);
        }
        if ((long)uVar9 < (long)uVar16) {
          do {
            (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_data.
            array[uVar9] = (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
                           m_storage.m_data.array[uVar9];
            uVar9 = uVar9 + 1;
          } while (uVar16 != uVar9);
        }
        lVar15 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_rows
        ;
        if (lVar15 == (pt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
                      m_rows) {
          if (lVar15 != 0) {
            if (lVar15 < 1) goto LAB_00116f52;
            func = (scalar_sum_op<double,_double> *)
                   &bx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                    m_rows;
            goto LAB_00116a30;
          }
          goto LAB_00116e4d;
        }
      }
    }
  }
LAB_00116ede:
  pcVar11 = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1, 0, 3, 1>, Rhs = const Eigen::Matrix<double, -1, 1, 0, 3, 1>]"
  ;
LAB_00116ef3:
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/root/.cache/CPM/eigen/9cb760a6fcc3143cbb7856ce4548b1cf4b385f2e/Eigen/src/Core/CwiseBinaryOp.h"
                ,0x74,pcVar11);
}

Assistant:

void point_triangle_squared_distance(
    const VectorMax3d& x,
    const std::array<VectorMax3d, 3>& f,
    VectorMax3d& pt,
    double& dist)
{
    const VectorMax3d& pa = f[0];
    const VectorMax3d& pb = f[1];
    const VectorMax3d& pc = f[2];

    // source: real time collision detection
    // check if x in vertex region outside pa
    VectorMax3d ab = pb - pa;
    VectorMax3d ac = pc - pa;
    VectorMax3d ax = x - pa;
    const double d1 = ab.dot(ax);
    const double d2 = ac.dot(ax);
    if (d1 <= 0 && d2 <= 0) {
        // barycentric coordinates (1, 0, 0)
        pt = pa;
        dist = (x - pt).squaredNorm();
        return;
    }

    // check if x in vertex region outside pb
    VectorMax3d bx = x - pb;
    const double d3 = ab.dot(bx);
    const double d4 = ac.dot(bx);
    if (d3 >= 0.0f && d4 <= d3) {
        // barycentric coordinates (0, 1, 0)
        pt = pb;
        dist = (x - pt).squaredNorm();
        return;
    }

    // check if x in vertex region outside pc
    VectorMax3d cx = x - pc;
    const double d5 = ab.dot(cx);
    const double d6 = ac.dot(cx);
    if (d6 >= 0.0f && d5 <= d6) {
        // barycentric coordinates (0, 0, 1)
        pt = pc;
        dist = (x - pt).squaredNorm();
        return;
    }

    // check if x in edge region of ab, if so return projection of x onto ab
    const double vc = d1 * d4 - d3 * d2;
    if (vc <= 0.0f && d1 >= 0.0f && d3 <= 0.0f) {
        // barycentric coordinates (1 - v, v, 0)
        const double v = d1 / (d1 - d3);
        pt = pa + ab * v;
        dist = (x - pt).squaredNorm();
        return;
    }

    // check if x in edge region of ac, if so return projection of x onto ac
    const double vb = d5 * d2 - d1 * d6;
    if (vb <= 0.0f && d2 >= 0.0f && d6 <= 0.0f) {
        // barycentric coordinates (1 - w, 0, w)
        const double w = d2 / (d2 - d6);
        pt = pa + ac * w;
        dist = (x - pt).squaredNorm();
        return;
    }

    // check if x in edge region of bc, if so return projection of x onto bc
    const double va = d3 * d6 - d5 * d4;
    if (va <= 0.0f && (d4 - d3) >= 0.0f && (d5 - d6) >= 0.0f) {
        // barycentric coordinates (0, 1 - w, w)
        const double w = (d4 - d3) / ((d4 - d3) + (d5 - d6));
        pt = pb + (pc - pb) * w;
        dist = (x - pt).squaredNorm();
        return;
    }

    // x inside face region. Compute pt through its barycentric coordinates (u,
    // v, w)
    const double denom = 1 / (va + vb + vc);
    const double v = vb * denom;
    const double w = vc * denom;

    pt = pa + ab * v + ac * w; //= u*a + v*b + w*c, u = va*denom = 1.0f - v - w
    dist = (x - pt).squaredNorm();
}